

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::InitBlockScopedContent
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,DebuggerScope *debuggerScope,
          FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  OpCode OVar1;
  ParseNode *this_01;
  Symbol *this_02;
  Scope *scope;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  PropertyId PVar5;
  uint uVar6;
  FuncInfo *this_03;
  ParseNodeVar *pPVar7;
  OpCode op;
  ParseNodePtr *ppPVar8;
  undefined4 *local_50;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop == knopBlock) {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_50 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x27b,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar3) {
LAB_00757197:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_50 = 0;
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                         ,0x1ef,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar3) goto LAB_00757197;
      *local_50 = 0;
    }
  }
  ppPVar8 = &pnodeBlock->pnodeLexVars;
  this_00 = &this->m_writer;
  do {
    this_01 = *ppPVar8;
    if (this_01 == (ParseNode *)0x0) {
      return;
    }
    if (debuggerScope == (DebuggerScope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x281,"(debuggerScope)",
                         "Missing a case of scope tracking in BeginEmitBlock.");
      if (!bVar3) goto LAB_00757197;
      *local_50 = 0;
    }
    this_03 = TopFuncInfo(this);
    pPVar7 = ParseNode::AsParseNodeVar(this_01);
    this_02 = pPVar7->sym;
    if ((this_02->field_0x42 & 8) == 0) {
      scope = this_02->scope;
      bVar3 = Symbol::IsInSlot(this_02,this,this_03,false);
      if ((bVar3) ||
         (((scope->field_0x44 & 2) != 0 &&
          (bVar3 = Symbol::NeedsSlotAlloc(this_02,this,this_03), bVar3)))) {
        if ((scope->field_0x44 & 2) == 0) {
          RVar4 = FuncInfo::AcquireTmpRegister(this_03);
          Js::ByteCodeWriter::Reg1(this_00,InitUndecl,RVar4);
          EmitLocalPropInit(this,RVar4,this_02,this_03);
          FuncInfo::ReleaseTmpRegister(this_03,RVar4);
LAB_00756fd7:
          PVar5 = Symbol::EnsurePosition(this_02,this);
          TrackSlotArrayPropertyForDebugger
                    (this,debuggerScope,this_02,PVar5,(uint)(this_01->nop == knopConstDecl),false);
        }
        else {
          RVar4 = scope->location;
          PVar5 = Symbol::EnsurePosition(this_02,this);
          if ((RVar4 == 0xffffffff) || (RVar4 != this_03->frameObjRegister)) {
            RVar4 = FuncInfo::InnerScopeToRegSlot(this_03,scope);
            uVar6 = FuncInfo::FindOrAddInlineCacheId(this_03,RVar4,PVar5,false,true);
            op = InitUndeclLetFld;
            if (this_02->decl->nop == knopConstDecl) {
              op = InitUndeclConstFld;
            }
            Js::ByteCodeWriter::ElementPIndexed(this_00,op,0xfffffffe,scope->innerScopeIndex,uVar6);
          }
          else {
            uVar6 = FuncInfo::FindOrAddInlineCacheId(this_03,RVar4,PVar5,false,true);
            Js::ByteCodeWriter::ElementP
                      (this_00,(ushort)(this_02->decl->nop == knopConstDecl) * 2 +
                               InitUndeclLocalLetFld,0xfffffffe,uVar6,false,true);
          }
          TrackActivationObjectPropertyForDebugger
                    (this,debuggerScope,this_02,(uint)(this_01->nop == knopConstDecl),false);
        }
      }
      else if ((this_02->field_0x43 & 0x40) == 0) {
        pPVar7 = ParseNode::AsParseNodeVar(this_02->decl);
        if (pPVar7->isSwitchStmtDecl != '\0') {
          Js::ByteCodeWriter::Reg1(this_00,InitUndecl,this_02->location);
        }
        bVar3 = Symbol::NeedsSlotAlloc(this_02,this,this_03);
        if (bVar3) goto LAB_00756fd7;
        TrackRegisterPropertyForDebugger
                  (this,debuggerScope,this_02,this_03,(uint)(this_01->nop == knopConstDecl),false);
      }
    }
    else {
      PVar5 = Symbol::EnsurePosition(this_02,this);
      if ((this->flags >> 10 & 1) == 0) {
        OVar1 = this_02->decl->nop;
        uVar6 = FuncInfo::FindOrAddReferencedPropertyId(this_03,PVar5);
        Js::ByteCodeWriter::ElementRootU
                  (this_00,OVar1 == knopConstDecl | InitUndeclRootLetFld,uVar6);
      }
      else {
        if ((this->flags >> 0x16 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_50 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x28c,"(this->IsConsoleScopeEval())",
                             "Let/Consts cannot be in global scope outside of console eval");
          if (!bVar3) goto LAB_00757197;
          *local_50 = 0;
        }
        OVar1 = this_02->decl->nop;
        uVar6 = FuncInfo::FindOrAddReferencedPropertyId(this_03,PVar5);
        Js::ByteCodeWriter::ElementScopedU
                  (this_00,(OVar1 == knopConstDecl) + InitUndeclConsoleLetFld,uVar6);
      }
    }
    pPVar7 = ParseNode::AsParseNodeVar(this_01);
    ppPVar8 = &pPVar7->pnodeNext;
  } while( true );
}

Assistant:

void ByteCodeGenerator::InitBlockScopedContent(ParseNodeBlock *pnodeBlock, Js::DebuggerScope* debuggerScope, FuncInfo *funcInfo)
{
    Assert(pnodeBlock->nop == knopBlock);

    auto genBlockInit = [this, debuggerScope, funcInfo](ParseNode *pnode)
    {
        // Only check if the scope is valid when let/const vars are in the scope.  If there are no let/const vars,
        // the debugger scope will not be created.
        AssertMsg(debuggerScope, "Missing a case of scope tracking in BeginEmitBlock.");

        FuncInfo *funcInfo = this->TopFuncInfo();
        Symbol *sym = pnode->AsParseNodeVar()->sym;
        Scope *scope = sym->GetScope();

        if (sym->GetIsGlobal())
        {
            Js::PropertyId propertyId = sym->EnsurePosition(this);
            if (this->flags & fscrEval)
            {
                AssertMsg(this->IsConsoleScopeEval(), "Let/Consts cannot be in global scope outside of console eval");
                Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ? Js::OpCode::InitUndeclConsoleConstFld : Js::OpCode::InitUndeclConsoleLetFld;
                this->m_writer.ElementScopedU(op, funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
            else
            {
                Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                    Js::OpCode::InitUndeclRootConstFld : Js::OpCode::InitUndeclRootLetFld;
                this->m_writer.ElementRootU(op, funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
        }
        else if (sym->IsInSlot(this, funcInfo) || (scope->GetIsObject() && sym->NeedsSlotAlloc(this, funcInfo)))
        {
            if (scope->GetIsObject())
            {
                Js::RegSlot scopeLocation = scope->GetLocation();
                Js::PropertyId propertyId = sym->EnsurePosition(this);

                if (scopeLocation != Js::Constants::NoRegister && scopeLocation == funcInfo->frameObjRegister)
                {
                    uint cacheId = funcInfo->FindOrAddInlineCacheId(scopeLocation, propertyId, false, true);

                    Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                        Js::OpCode::InitUndeclLocalConstFld : Js::OpCode::InitUndeclLocalLetFld;

                    this->m_writer.ElementP(op, ByteCodeGenerator::ReturnRegister, cacheId);
                }
                else
                {
                    uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->InnerScopeToRegSlot(scope), propertyId, false, true);

                    Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                        Js::OpCode::InitUndeclConstFld : Js::OpCode::InitUndeclLetFld;

                    this->m_writer.ElementPIndexed(op, ByteCodeGenerator::ReturnRegister, scope->GetInnerScopeIndex(), cacheId);
                }

                TrackActivationObjectPropertyForDebugger(debuggerScope, sym, pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
            else
            {
                Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                this->m_writer.Reg1(Js::OpCode::InitUndecl, tmpReg);
                this->EmitLocalPropInit(tmpReg, sym, funcInfo);
                funcInfo->ReleaseTmpRegister(tmpReg);

                // Slot array properties are tracked in non-debug mode as well because they need to stay
                // around for heap enumeration and escaping during attach/detach.
                TrackSlotArrayPropertyForDebugger(debuggerScope, sym, sym->EnsurePosition(this), pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
        }
        else if (!sym->GetIsModuleExportStorage())
        {
            if (sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl)
            {
                // let/const declared in a switch is the only case of a variable that must be checked for
                // use-before-declaration dynamically within its own function.
                this->m_writer.Reg1(Js::OpCode::InitUndecl, sym->GetLocation());
            }
            // Syms that begin in register may be delay-captured. In debugger mode, such syms
            // will live only in slots, so tell the debugger to find them there.
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                TrackSlotArrayPropertyForDebugger(debuggerScope, sym, sym->EnsurePosition(this), pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
            else
            {
                TrackRegisterPropertyForDebugger(debuggerScope, sym, funcInfo, pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
        }
    };

    IterateBlockScopedVariables(pnodeBlock, genBlockInit);
}